

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O2

int aom_count_primitive_refsubexpfin(uint16_t n,uint16_t k,uint16_t ref,uint16_t v)

{
  int iVar1;
  uint16_t uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  undefined6 in_register_00000032;
  int iVar7;
  undefined6 in_register_0000003a;
  int iVar8;
  int iVar9;
  
  uVar2 = recenter_finite_nonneg(n,ref,v);
  iVar1 = (int)CONCAT62(in_register_00000032,k);
  iVar9 = iVar1 + -1;
  iVar8 = -1;
  iVar7 = 0;
  uVar6 = 0;
  while( true ) {
    uVar3 = uVar6 - 1;
    bVar4 = (byte)iVar9;
    if (uVar6 == 0) {
      bVar4 = (byte)k;
    }
    iVar5 = (int)CONCAT62(in_register_0000003a,n);
    if (iVar5 <= (3 << (bVar4 & 0x1f)) + iVar7) break;
    iVar7 = iVar7 + (1 << (bVar4 & 0x1f));
    iVar8 = iVar8 + 1;
    iVar9 = iVar9 + 1;
    uVar6 = uVar3;
    if ((int)(uint)uVar2 < iVar7) {
      return ~uVar3 + iVar1 + iVar8 + (uint)(iVar8 == 0);
    }
  }
  uVar3 = iVar5 - iVar7;
  iVar8 = 0;
  if (1 < (ushort)uVar3) {
    uVar3 = uVar3 & 0xffff;
    iVar8 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar8 == 0; iVar8 = iVar8 + -1) {
      }
    }
    iVar8 = (uint)((int)((2 << ((byte)iVar8 & 0x1f)) - uVar3) <= (int)((uint)uVar2 - iVar7 & 0xffff)
                  ) + iVar8;
  }
  return iVar8 - uVar6;
}

Assistant:

int aom_count_primitive_refsubexpfin(uint16_t n, uint16_t k, uint16_t ref,
                                     uint16_t v) {
  return count_primitive_subexpfin(n, k, recenter_finite_nonneg(n, ref, v));
}